

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

int cpu_memory_rw_debug_mips
              (CPUState *cpu,target_ulong addr,void *ptr,target_ulong len,_Bool is_write)

{
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var1;
  AddressSpace *as;
  vaddr vVar2;
  undefined4 in_EAX;
  uint uVar3;
  hwaddr hVar4;
  uint uVar5;
  ulong uVar6;
  undefined7 in_register_00000081;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  MemTxAttrs attrs;
  undefined4 local_34;
  
  _attrs = CONCAT44((int)CONCAT71(in_register_00000081,is_write),in_EAX);
  uVar6 = len & 0xffffffff;
  uVar8 = addr & 0xffffffff;
  while( true ) {
    uVar5 = (uint)uVar6;
    if (uVar5 == 0) {
      return 0;
    }
    uVar9 = (uint)uVar8;
    p_Var1 = cpu->cc->get_phys_page_attrs_debug;
    vVar2 = (vaddr)(uVar9 & 0xfffff000);
    if (p_Var1 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
      _attrs = CONCAT44(local_34,1);
      hVar4 = (*cpu->cc->get_phys_page_debug)((CPUState_conflict *)cpu,vVar2);
    }
    else {
      hVar4 = (*p_Var1)((CPUState_conflict *)cpu,vVar2,&attrs);
    }
    uVar3 = cpu_asidx_from_attrs(cpu,attrs);
    if (hVar4 == 0xffffffffffffffff) break;
    uVar7 = ((uVar9 & 0xfffff000) - uVar9) + 0x1000;
    uVar8 = (ulong)uVar7;
    if (uVar5 <= uVar7) {
      uVar8 = uVar6;
    }
    hVar4 = hVar4 + (uVar9 & 0xfff);
    as = cpu->cpu_ases[uVar3].as;
    if ((char)local_34 == '\0') {
      address_space_read_full_mips(as,hVar4,attrs,ptr,uVar8);
    }
    else {
      address_space_write_rom_mips(as,hVar4,attrs,ptr,uVar8);
    }
    uVar6 = (ulong)(uVar5 - (int)uVar8);
    ptr = (void *)((long)ptr + uVar8);
    uVar8 = (ulong)(uVar9 + (int)uVar8);
  }
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}